

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wapiti_wrap.cxx
# Opt level: O2

void SWIG_JavaThrowException(JNIEnv *jenv,SWIG_JavaExceptionCodes code,char *msg)

{
  SWIG_JavaExceptions_t *pSVar1;
  jclass p_Var2;
  SWIG_JavaExceptions_t *pSVar3;
  
  pSVar1 = SWIG_JavaThrowException::java_exceptions;
  do {
    pSVar3 = pSVar1;
    if (pSVar3->code == code) break;
    pSVar1 = pSVar3 + 1;
  } while (pSVar3->code != 0);
  (*jenv->functions->ExceptionClear)(jenv);
  p_Var2 = (*jenv->functions->FindClass)(jenv,pSVar3->java_exception);
  if (p_Var2 != (jclass)0x0) {
    (*jenv->functions->ThrowNew)(jenv,p_Var2,msg);
    return;
  }
  return;
}

Assistant:

static void SWIGUNUSED SWIG_JavaThrowException(JNIEnv *jenv, SWIG_JavaExceptionCodes code, const char *msg) {
  jclass excep;
  static const SWIG_JavaExceptions_t java_exceptions[] = {
    { SWIG_JavaOutOfMemoryError, "java/lang/OutOfMemoryError" },
    { SWIG_JavaIOException, "java/io/IOException" },
    { SWIG_JavaRuntimeException, "java/lang/RuntimeException" },
    { SWIG_JavaIndexOutOfBoundsException, "java/lang/IndexOutOfBoundsException" },
    { SWIG_JavaArithmeticException, "java/lang/ArithmeticException" },
    { SWIG_JavaIllegalArgumentException, "java/lang/IllegalArgumentException" },
    { SWIG_JavaNullPointerException, "java/lang/NullPointerException" },
    { SWIG_JavaDirectorPureVirtual, "java/lang/RuntimeException" },
    { SWIG_JavaUnknownError,  "java/lang/UnknownError" },
    { (SWIG_JavaExceptionCodes)0,  "java/lang/UnknownError" }
  };
  const SWIG_JavaExceptions_t *except_ptr = java_exceptions;

  while (except_ptr->code != code && except_ptr->code)
    except_ptr++;

  jenv->ExceptionClear();
  excep = jenv->FindClass(except_ptr->java_exception);
  if (excep)
    jenv->ThrowNew(excep, msg);
}